

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_misc.c
# Opt level: O1

void wrtsep(FILE *out,char fill,char *title,int nchar)

{
  size_t sVar1;
  char *__dest;
  uint uVar2;
  char *pcVar3;
  char *__s;
  uint uVar4;
  ulong uVar5;
  
  sVar1 = strlen(title);
  uVar4 = (uint)sVar1;
  if (nchar < (int)uVar4) {
    nchar = uVar4;
  }
  if (nchar < 1) {
    return;
  }
  __dest = (char *)malloc((ulong)(nchar + 1));
  if ((int)uVar4 < 1) {
    memset(__dest,(uint)(byte)fill,(ulong)(uint)nchar);
    __s = __dest + (uint)nchar;
  }
  else {
    uVar2 = (int)(nchar - uVar4) / 2;
    pcVar3 = __dest;
    if (1 < (int)(nchar - uVar4)) {
      memset(__dest,(uint)(byte)fill,(ulong)(uVar2 - 1) + 1);
      pcVar3 = __dest + (ulong)(uVar2 - 1) + 1;
    }
    *pcVar3 = '\0';
    strcat(__dest,title);
    __s = pcVar3 + (uVar4 & 0x7fffffff);
    if ((int)(uVar2 + uVar4) < nchar) {
      uVar5 = (ulong)((nchar + ~uVar2) - uVar4);
      memset(__s,(uint)(byte)fill,uVar5 + 1);
      __s = pcVar3 + (uVar4 & 0x7fffffff) + uVar5 + 1;
    }
  }
  *__s = '\0';
  if (out != (FILE *)0x0) {
    fprintf((FILE *)out,"%s\n",__dest);
  }
  if (_stdout == out) {
    fflush((FILE *)out);
  }
  free(__dest);
  return;
}

Assistant:

void wrtsep(FILE *out,char fill, char *title, int nchar)
/* print a line of char fill with string title in the middle */
{
    int ntitle; 
    char *line; 
    char *p;
    int first_end;
    int i = 0;

    ntitle = strlen(title); 
    if(ntitle > nchar) nchar = ntitle;
    if(nchar <= 0) return; 
    line = (char *)malloc((nchar+1)*sizeof(char)); 
    p = line;
    if(ntitle < 1) { 
        for (i=0; i < nchar; i++) {*p = fill; p++;}	
	*p = '\0';
    }
    else { 
	first_end = ( nchar - ntitle)/2; 
	for (i = 0; i < first_end; i++) { *p = fill; p++;}
	*p = '\0';
	strcat(line, title);
	p += ntitle;
        for( i = first_end + ntitle; i < nchar; i++) {*p = fill; p++;}
	*p = '\0';
    }
    if(out != NULL )fprintf(out,"%s\n",line);
    if(out == stdout )fflush(out);
    free (line);
    return ;
}